

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::~ConcreteMachine(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
                   *this)

{
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00589e50;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00589f48;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00589f80;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00589f98;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00589fb0;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00589fc8;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00589ff8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0058a038;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0058a058;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&DAT_0058a070;
  (this->super_Delegate).super_Delegate._vptr_Delegate = (_func_int **)&DAT_0058a088;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_0058a0a8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0058a0c0;
  (this->super_SpecialKeyHandler)._vptr_SpecialKeyHandler = (_func_int **)&DAT_0058a0e0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&this->audio_queue_);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  ~unique_ptr(&this->string_serialiser_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->pravetz_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  JustInTimeActor<Apple::DiskII,_Cycles,_1,_1>::~JustInTimeActor(&this->diskii_);
  Storage::Disk::MFMController::~MFMController((MFMController *)&this->bd500_);
  Storage::Disk::MFMController::~MFMController((MFMController *)&this->jasmin_);
  Storage::Disk::MFMController::~MFMController((MFMController *)&this->microdisc_);
  std::
  vector<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ::~vector(&(this->via_port_handler_).joysticks_);
  TapePlayer::~TapePlayer(&this->tape_player_);
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::~LowpassBase(&(this->speaker_).
                  super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                );
  Concurrency::AsyncTaskQueue<false,_true,_void>::~AsyncTaskQueue(&this->audio_queue_);
  JustInTimeActor<Oric::VideoOutput,_Cycles,_1,_1>::~JustInTimeActor(&this->video_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->disk_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  return;
}

Assistant:

~ConcreteMachine() {
			audio_queue_.flush();
		}